

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

bool ApplyEnclosesArgs(ParseNode *fncDecl,ByteCodeGenerator *byteCodeGenerator)

{
  Utf8SourceInfo *pUVar1;
  ParseNodeFnc *pPVar2;
  ParseNodeVisitor<ApplyCheck> prefix;
  ParseNodeVisitor<ApplyCheck> postfix;
  ApplyCheck local_23 [2];
  ApplyCheck applyCheck;
  
  pUVar1 = byteCodeGenerator->m_utf8SourceInfo;
  if ((((((pUVar1->debugModeSource).ptr == (uchar *)0x0) && ((pUVar1->field_0xa8 & 0x20) == 0)) ||
       ((pUVar1->field_0xa8 & 0x40) == 0)) &&
      ((fncDecl->nop != knopFncDecl || ((fncDecl->grfpn & 4) == 0)))) &&
     ((pPVar2 = ParseNode::AsParseNodeFnc(fncDecl), pPVar2->pnodeParams == (ParseNodePtr)0x0 &&
      ((pPVar2 = ParseNode::AsParseNodeFnc(fncDecl), pPVar2->pnodeRest == (ParseNodePtr)0x0 &&
       (pPVar2 = ParseNode::AsParseNodeFnc(fncDecl), pPVar2->nestedCount == 0)))))) {
    local_23[0].matches = true;
    local_23[0].insideApplyCall = false;
    local_23[0].sawApply = false;
    pPVar2 = ParseNode::AsParseNodeFnc(fncDecl);
    prefix.m_fn = CheckApplyEnclosesArgs;
    prefix.m_context = local_23;
    postfix.m_fn = PostCheckApplyEnclosesArgs;
    postfix.m_context = local_23;
    Visit<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
              (pPVar2->pnodeBody,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    return (bool)(local_23[0].sawApply & local_23[0].matches);
  }
  return false;
}

Assistant:

bool ApplyEnclosesArgs(ParseNode* fncDecl, ByteCodeGenerator* byteCodeGenerator)
{
    if (byteCodeGenerator->IsInDebugMode())
    {
        // Inspection of the arguments object will be messed up if we do ApplyArgs.
        return false;
    }

    if (!fncDecl->HasVarArguments()
        && fncDecl->AsParseNodeFnc()->pnodeParams == nullptr
        && fncDecl->AsParseNodeFnc()->pnodeRest == nullptr
        && fncDecl->AsParseNodeFnc()->nestedCount == 0)
    {
        ApplyCheck applyCheck;
        applyCheck.matches = true;
        applyCheck.sawApply = false;
        applyCheck.insideApplyCall = false;
        VisitIndirect<ApplyCheck>(fncDecl->AsParseNodeFnc()->pnodeBody, byteCodeGenerator, &applyCheck, &CheckApplyEnclosesArgs, &PostCheckApplyEnclosesArgs);
        return applyCheck.matches&&applyCheck.sawApply;
    }

    return false;
}